

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::compile_fixture::build_apply(compile_fixture *this)

{
  byte bVar1;
  logic_error e;
  _func_unsigned_long_void_ptr_varargs *local_d0;
  fun_ptr f;
  uint64_t size;
  first_pass_data d;
  asmcode local_40 [8];
  asmcode code;
  compile_fixture *this_local;
  
  assembler::asmcode::asmcode(local_40);
  bVar1 = skiwi::load_apply((shared_ptr *)&this->env,&this->rd,&this->md,&this->ctxt,local_40,
                            (map *)&this->pm,&this->ops);
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"Cannot load apply\n");
  }
  else {
    digest_asmcode(local_40);
    assembler::first_pass_data::first_pass_data((first_pass_data *)&size);
    local_d0 = (_func_unsigned_long_void_ptr_varargs *)
               assembler::assemble((ulong *)&f,(first_pass_data *)&size,local_40);
    (*local_d0)(&this->ctxt);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)&this->compiled_functions,&local_d0,(unsigned_long *)&f);
    assembler::first_pass_data::~first_pass_data((first_pass_data *)&size);
  }
  assembler::asmcode::~asmcode(local_40);
  return;
}

Assistant:

void build_apply()
      {
      asmcode code;
      try
        {
        if (load_apply(env, rd, md, ctxt, code, pm, ops))
          {
          digest_asmcode(code);
          first_pass_data d;
          uint64_t size;
          fun_ptr f = (fun_ptr)assemble(size, d, code);
          f(&ctxt);
          compiled_functions.emplace_back(f, size);
          }
        else
          std::cout << "Cannot load apply\n";
        }
      catch (std::logic_error e)
        {
        std::cout << e.what() << " while compiling apply library\n\n";
        }
      }